

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# float.c
# Opt level: O0

sysbvm_tuple_t
sysbvm_float32_primitive_asIEEEFloat32Decoded
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  float value;
  sysbvm_tuple_t sVar1;
  float floatValue;
  uint32_t uint32Value;
  sysbvm_tuple_t *arguments_local;
  size_t argumentCount_local;
  sysbvm_tuple_t closure_local;
  sysbvm_context_t *context_local;
  
  if (argumentCount != 1) {
    sysbvm_error_argumentCountMismatch(1,argumentCount);
  }
  value = (float)sysbvm_tuple_uint32_decode(*arguments);
  sVar1 = sysbvm_tuple_float32_encode(context,value);
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_float32_primitive_asIEEEFloat32Decoded(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    if(argumentCount != 1) sysbvm_error_argumentCountMismatch(1, argumentCount);

    uint32_t uint32Value = sysbvm_tuple_uint32_decode(arguments[0]);
    float floatValue = 0;
    memcpy(&floatValue, &uint32Value, 4);

    return sysbvm_tuple_float32_encode(context, floatValue);
}